

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cast.h
# Opt level: O0

bool __thiscall
pybind11::detail::argument_loader<pybind11::object,pybind11::object>::load_impl_sequence<0ul,1ul>
          (void *param_1,long param_2)

{
  reference pvVar1;
  handle src;
  const_iterator pbVar2;
  const_iterator pbVar3;
  reference rVar4;
  bool r;
  const_iterator __end0;
  const_iterator __begin0;
  initializer_list<bool> *__range3;
  size_type in_stack_ffffffffffffff88;
  undefined1 uVar5;
  vector<bool,_std::allocator<bool>_> *in_stack_ffffffffffffff90;
  handle in_stack_ffffffffffffff98;
  reference local_50;
  PyObject *local_40;
  bool local_32;
  undefined1 local_31;
  initializer_list<bool> local_30;
  initializer_list<bool> *local_20;
  long local_18;
  void *local_10;
  
  local_18 = param_2;
  local_10 = param_1;
  std::
  get<0ul,pybind11::detail::type_caster<pybind11::object,void>,pybind11::detail::type_caster<pybind11::object,void>>
            ((tuple<pybind11::detail::type_caster<pybind11::object,_void>,_pybind11::detail::type_caster<pybind11::object,_void>_>
              *)0x3a2d59);
  pvVar1 = std::vector<pybind11::handle,_std::allocator<pybind11::handle>_>::operator[]
                     ((vector<pybind11::handle,_std::allocator<pybind11::handle>_> *)(local_18 + 8),
                      0);
  local_40 = pvVar1->m_ptr;
  local_50 = std::vector<bool,_std::allocator<bool>_>::operator[]
                       (in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
  std::_Bit_reference::operator_cast_to_bool(&local_50);
  local_32 = pyobject_caster<pybind11::object>::load<pybind11::object,_0>
                       ((pyobject_caster<pybind11::object> *)in_stack_ffffffffffffff90,
                        in_stack_ffffffffffffff98,SUB81(in_stack_ffffffffffffff88 >> 0x38,0));
  std::
  get<1ul,pybind11::detail::type_caster<pybind11::object,void>,pybind11::detail::type_caster<pybind11::object,void>>
            ((tuple<pybind11::detail::type_caster<pybind11::object,_void>,_pybind11::detail::type_caster<pybind11::object,_void>_>
              *)0x3a2dc7);
  std::vector<pybind11::handle,_std::allocator<pybind11::handle>_>::operator[]
            ((vector<pybind11::handle,_std::allocator<pybind11::handle>_> *)(local_18 + 8),1);
  rVar4 = std::vector<bool,_std::allocator<bool>_>::operator[]
                    (in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
  src.m_ptr = (PyObject *)rVar4._M_p;
  uVar5 = (undefined1)(in_stack_ffffffffffffff88 >> 0x38);
  std::_Bit_reference::operator_cast_to_bool((_Bit_reference *)&stack0xffffffffffffff98);
  local_31 = pyobject_caster<pybind11::object>::load<pybind11::object,_0>
                       ((pyobject_caster<pybind11::object> *)in_stack_ffffffffffffff90,src,
                        (bool)uVar5);
  local_30._M_array = &local_32;
  local_30._M_len = 2;
  local_20 = &local_30;
  pbVar2 = std::initializer_list<bool>::begin(local_20);
  pbVar3 = std::initializer_list<bool>::end((initializer_list<bool> *)param_1);
  while( true ) {
    if (pbVar2 == pbVar3) {
      return true;
    }
    if ((*pbVar2 & 1U) == 0) break;
    pbVar2 = pbVar2 + 1;
  }
  return false;
}

Assistant:

bool load_impl_sequence(function_call &call, index_sequence<Is...>) {
#ifdef __cpp_fold_expressions
        if ((... || !std::get<Is>(argcasters).load(call.args[Is], call.args_convert[Is])))
            return false;
#else
        for (bool r : {std::get<Is>(argcasters).load(call.args[Is], call.args_convert[Is])...})
            if (!r)
                return false;
#endif
        return true;
    }